

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authenticate(Curl_easy *data,char *mech,bufref *initresp)

{
  uchar *puVar1;
  char *ir;
  CURLcode result;
  bufref *initresp_local;
  char *mech_local;
  Curl_easy *data_local;
  
  puVar1 = Curl_bufref_ptr(initresp);
  if (puVar1 == (uchar *)0x0) {
    ir._4_4_ = imap_sendf(data,"AUTHENTICATE %s",mech);
  }
  else {
    ir._4_4_ = imap_sendf(data,"AUTHENTICATE %s %s",mech,puVar1);
  }
  return ir._4_4_;
}

Assistant:

static CURLcode imap_perform_authenticate(struct Curl_easy *data,
                                          const char *mech,
                                          const struct bufref *initresp)
{
  CURLcode result = CURLE_OK;
  const char *ir = (const char *) Curl_bufref_ptr(initresp);

  if(ir) {
    /* Send the AUTHENTICATE command with the initial response */
    result = imap_sendf(data, "AUTHENTICATE %s %s", mech, ir);
  }
  else {
    /* Send the AUTHENTICATE command */
    result = imap_sendf(data, "AUTHENTICATE %s", mech);
  }

  return result;
}